

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O1

void HBLAS2::hblas2_gemv_square_LDSame<HAXX::quaternion<double>,HAXX::quaternion<double>,(char)84>
               (void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  quaternion<double> ALPHA_00;
  quaternion<double> BETA_00;
  pointer pqVar16;
  quaternion<double> *__cur;
  quaternion<double> *pqVar17;
  quaternion<double> *X;
  ostream *poVar18;
  basic_ostream<char,_std::char_traits<char>_> *pbVar19;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  quaternion<double> *pqVar20;
  quaternion<double> *x;
  long lVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  double dVar26;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [32];
  undefined1 auVar30 [16];
  double dVar27;
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  __m128d yLo;
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  quaternion<double> BETA;
  quaternion<double> ALPHA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> YC;
  stringstream ss;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_3a8;
  quaternion<double> *local_390;
  quaternion<double> local_388;
  undefined **local_368;
  undefined8 uStack_360;
  undefined8 *puStack_358;
  char **ppcStack_350;
  undefined1 local_348 [32];
  undefined1 local_328 [32];
  undefined1 local_308 [32];
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  quaternion<double> local_268;
  quaternion<double> local_248;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_228;
  undefined1 local_210 [8];
  undefined8 local_208;
  shared_count sStack_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 auVar47 [32];
  undefined1 auVar62 [32];
  undefined1 auVar88 [32];
  
  pqVar17 = (quaternion<double> *)operator_new(320000);
  memset(pqVar17,0,320000);
  X = (quaternion<double> *)operator_new(0xc80);
  memset(X,0,0xc80);
  local_3a8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3a8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0xc80);
  pqVar20 = local_3a8.
            super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 100;
  local_3a8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_3a8.
       super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_3a8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pqVar20;
  memset(local_3a8.
         super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
         _M_impl.super__Vector_impl_data._M_start,0,0xc80);
  lVar21 = 0x18;
  local_3a8.super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pqVar20;
  do {
    local_368 = (undefined **)
                std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                          (&gen);
    dVar27 = _ZL3dis_0;
    local_288._0_8_ = _ZL3dis_1;
    dVar26 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    local_2a8._0_8_ = dVar26;
    local_2e8._0_8_ = _ZL3dis_1;
    local_2c8._0_8_ = _ZL3dis_0;
    dVar26 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    local_308._0_8_ = dVar26;
    local_348._0_8_ = _ZL3dis_1;
    local_328._0_8_ = _ZL3dis_0;
    auVar32._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    pqVar16 = local_3a8.
              super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    auVar32._8_56_ = extraout_var;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = dVar27;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = local_368;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = (double)local_288._0_8_ - dVar27;
    auVar97 = vfmadd132sd_fma(auVar37,auVar49,auVar97);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_2c8._0_8_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_2a8._0_8_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = (double)local_2e8._0_8_ - (double)local_2c8._0_8_;
    auVar1 = vfmadd132sd_fma(auVar50,auVar64,auVar1);
    auVar75._8_8_ = 0;
    auVar75._0_8_ = local_328._0_8_;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_308._0_8_;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = (double)local_348._0_8_ - (double)local_328._0_8_;
    auVar2 = vfmadd132sd_fma(auVar65,auVar75,auVar2);
    auVar91._8_8_ = 0;
    auVar91._0_8_ = _ZL3dis_0;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = _ZL3dis_1 - _ZL3dis_0;
    auVar37 = vfmadd213sd_fma(auVar76,auVar32._0_16_,auVar91);
    *(long *)((long)X + lVar21 + -0x18) = auVar97._0_8_;
    *(long *)((long)X + lVar21 + -0x10) = auVar1._0_8_;
    *(long *)((long)X + lVar21 + -8) = auVar2._0_8_;
    *(long *)((long)&X->_M_real + lVar21) = auVar37._0_8_;
    lVar21 = lVar21 + 0x20;
    pqVar20 = local_3a8.
              super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  } while (lVar21 != 0xc98);
  for (; pqVar20 != pqVar16; pqVar20 = pqVar20 + 1) {
    local_368 = (undefined **)
                std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                          (&gen);
    dVar27 = _ZL3dis_0;
    local_288._0_8_ = _ZL3dis_1;
    dVar26 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    local_2a8._0_8_ = dVar26;
    local_2e8._0_8_ = _ZL3dis_1;
    local_2c8._0_8_ = _ZL3dis_0;
    dVar26 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    local_308._0_8_ = dVar26;
    local_348._0_8_ = _ZL3dis_1;
    local_328._0_8_ = _ZL3dis_0;
    auVar33._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    auVar33._8_56_ = extraout_var_00;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = dVar27;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_368;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = (double)local_288._0_8_ - dVar27;
    auVar97 = vfmadd132sd_fma(auVar38,auVar51,auVar3);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = local_2c8._0_8_;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_2a8._0_8_;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = (double)local_2e8._0_8_ - (double)local_2c8._0_8_;
    auVar1 = vfmadd132sd_fma(auVar52,auVar66,auVar4);
    auVar77._8_8_ = 0;
    auVar77._0_8_ = local_328._0_8_;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_308._0_8_;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = (double)local_348._0_8_ - (double)local_328._0_8_;
    auVar2 = vfmadd132sd_fma(auVar67,auVar77,auVar5);
    auVar92._8_8_ = 0;
    auVar92._0_8_ = _ZL3dis_0;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = _ZL3dis_1 - _ZL3dis_0;
    auVar37 = vfmadd213sd_fma(auVar78,auVar33._0_16_,auVar92);
    pqVar20->_M_real = auVar97._0_8_;
    pqVar20->_M_imag_i = auVar1._0_8_;
    pqVar20->_M_imag_j = auVar2._0_8_;
    pqVar20->_M_imag_k = auVar37._0_8_;
  }
  lVar21 = 0x18;
  do {
    local_368 = (undefined **)
                std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                          (&gen);
    dVar27 = _ZL3dis_0;
    local_288._0_8_ = _ZL3dis_1;
    dVar26 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    local_2a8._0_8_ = dVar26;
    local_2e8._0_8_ = _ZL3dis_1;
    local_2c8._0_8_ = _ZL3dis_0;
    dVar26 = std::
             generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                       (&gen);
    local_308._0_8_ = dVar26;
    local_348._0_8_ = _ZL3dis_1;
    local_328._0_8_ = _ZL3dis_0;
    auVar34._0_8_ =
         std::
         generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                   (&gen);
    auVar34._8_56_ = extraout_var_01;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar27;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_368;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = (double)local_288._0_8_ - dVar27;
    auVar97 = vfmadd132sd_fma(auVar39,auVar53,auVar6);
    auVar68._8_8_ = 0;
    auVar68._0_8_ = local_2c8._0_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_2a8._0_8_;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = (double)local_2e8._0_8_ - (double)local_2c8._0_8_;
    auVar1 = vfmadd132sd_fma(auVar54,auVar68,auVar7);
    auVar79._8_8_ = 0;
    auVar79._0_8_ = local_328._0_8_;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_308._0_8_;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = (double)local_348._0_8_ - (double)local_328._0_8_;
    auVar2 = vfmadd132sd_fma(auVar69,auVar79,auVar8);
    auVar93._8_8_ = 0;
    auVar93._0_8_ = _ZL3dis_0;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = _ZL3dis_1 - _ZL3dis_0;
    auVar37 = vfmadd213sd_fma(auVar80,auVar34._0_16_,auVar93);
    *(long *)((long)pqVar17 + lVar21 + -0x18) = auVar97._0_8_;
    *(long *)((long)pqVar17 + lVar21 + -0x10) = auVar1._0_8_;
    *(long *)((long)pqVar17 + lVar21 + -8) = auVar2._0_8_;
    *(long *)((long)&pqVar17->_M_real + lVar21) = auVar37._0_8_;
    lVar21 = lVar21 + 0x20;
  } while (lVar21 != 0x4e218);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&local_228,&local_3a8);
  local_390 = pqVar17;
  local_368 = (undefined **)
              std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&gen);
  dVar27 = _ZL3dis_0;
  local_288._0_8_ = _ZL3dis_1;
  dVar26 = std::
           generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                     (&gen);
  local_2e8._0_8_ = _ZL3dis_1;
  local_2c8._0_8_ = _ZL3dis_0;
  local_2a8._0_8_ = dVar26;
  dVar26 = std::
           generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                     (&gen);
  local_348._0_8_ = _ZL3dis_1;
  local_328._0_8_ = _ZL3dis_0;
  local_308._0_8_ = dVar26;
  auVar35._0_8_ =
       std::
       generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                 (&gen);
  auVar35._8_56_ = extraout_var_02;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar27;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_368;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = (double)local_288._0_8_ - dVar27;
  auVar97 = vfmadd132sd_fma(auVar40,auVar55,auVar9);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = local_2c8._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_2a8._0_8_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = (double)local_2e8._0_8_ - (double)local_2c8._0_8_;
  auVar1 = vfmadd132sd_fma(auVar56,auVar70,auVar10);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = local_328._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_308._0_8_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = (double)local_348._0_8_ - (double)local_328._0_8_;
  auVar2 = vfmadd132sd_fma(auVar71,auVar81,auVar11);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = _ZL3dis_0;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = _ZL3dis_1 - _ZL3dis_0;
  auVar37 = vfmadd213sd_fma(auVar82,auVar35._0_16_,auVar94);
  local_248._M_real = auVar97._0_8_;
  local_248._M_imag_i = auVar1._0_8_;
  local_248._M_imag_j = auVar2._0_8_;
  local_248._M_imag_k = auVar37._0_8_;
  local_368 = (undefined **)
              std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&gen);
  dVar27 = _ZL3dis_0;
  local_288._0_8_ = _ZL3dis_1;
  local_2a8._0_8_ =
       std::
       generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                 (&gen);
  local_2e8._0_8_ = _ZL3dis_1;
  local_2c8._0_8_ = _ZL3dis_0;
  local_308._0_8_ =
       std::
       generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                 (&gen);
  local_348._0_8_ = _ZL3dis_1;
  local_328._0_8_ = _ZL3dis_0;
  auVar36._0_8_ =
       std::
       generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                 (&gen);
  auVar36._8_56_ = extraout_var_03;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar27;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_368;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = (double)local_288._0_8_ - dVar27;
  auVar97 = vfmadd132sd_fma(auVar41,auVar57,auVar12);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = local_2c8._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_2a8._0_8_;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = (double)local_2e8._0_8_ - (double)local_2c8._0_8_;
  auVar1 = vfmadd132sd_fma(auVar58,auVar72,auVar13);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = local_328._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_308._0_8_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = (double)local_348._0_8_ - (double)local_328._0_8_;
  auVar2 = vfmadd132sd_fma(auVar73,auVar83,auVar14);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = _ZL3dis_0;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = _ZL3dis_1 - _ZL3dis_0;
  auVar37 = vfmadd213sd_fma(auVar84,auVar36._0_16_,auVar95);
  local_268._M_real = auVar97._0_8_;
  local_268._M_imag_i = auVar1._0_8_;
  local_268._M_imag_j = auVar2._0_8_;
  local_268._M_imag_k = auVar37._0_8_;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"hblas2_gemv_square_",0x13);
  local_388._M_real = (double)CONCAT71(local_388._M_real._1_7_,0x54);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_388,1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Q",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Q",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"_LDSame",7);
  std::__cxx11::stringbuf::str();
  poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_388._M_real,
                       CONCAT71(local_388._M_imag_i._1_7_,local_388._M_imag_i._0_1_));
  std::__ostream_insert<char,std::char_traits<char>>(poVar18," will use",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
  std::ostream::put((char)poVar18);
  std::ostream::flush();
  if ((double *)local_388._M_real != &local_388._M_imag_j) {
    operator_delete((void *)local_388._M_real,(long)local_388._M_imag_j + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ALPHA = ",10);
  pbVar19 = HAXX::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_248);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar19 + -0x18) + (char)pbVar19);
  std::ostream::put((char)pbVar19);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  BETA = ",9);
  pbVar19 = HAXX::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_268);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar19 + -0x18) + (char)pbVar19);
  std::ostream::put((char)pbVar19);
  std::ostream::flush();
  ALPHA_00._M_imag_i = local_248._M_imag_i;
  ALPHA_00._M_real = local_248._M_real;
  ALPHA_00._M_imag_j = local_248._M_imag_j;
  ALPHA_00._M_imag_k = local_248._M_imag_k;
  BETA_00._M_imag_i = local_268._M_imag_i;
  BETA_00._M_real = local_268._M_real;
  BETA_00._M_imag_j = local_268._M_imag_j;
  BETA_00._M_imag_k = local_268._M_imag_k;
  HAXX::
  HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>>
            ('T',100,100,ALPHA_00,pqVar17,100,X,1,BETA_00,
             local_3a8.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,1);
  lVar21 = 0;
  do {
    HAXX::HBLAS_DOTUV<double>(&local_388,100,pqVar17,1,X,1);
    uStack_360 = CONCAT71(local_388._M_imag_i._1_7_,local_388._M_imag_i._0_1_);
    local_368 = (undefined **)local_388._M_real;
    puStack_358 = (undefined8 *)local_388._M_imag_j;
    ppcStack_350 = (char **)local_388._M_imag_k;
    local_1c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_1c0 = "";
    local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0x47,&local_1d8);
    pqVar16 = local_3a8.
              super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    auVar15._8_8_ = local_248._M_imag_i;
    auVar15._0_8_ = local_248._M_real;
    auVar15._16_8_ = local_248._M_imag_j;
    auVar15._24_8_ = local_248._M_imag_k;
    auVar86._8_8_ = uStack_360;
    auVar86._0_8_ = local_368;
    auVar86._16_8_ = puStack_358;
    auVar86._24_8_ = ppcStack_350;
    auVar24 = vpermpd_avx2(auVar86,0xe7);
    auVar37 = auVar86._16_16_;
    auVar25 = vpermpd_avx2(auVar15,0x9f);
    auVar97 = vshufpd_avx(auVar37,auVar37,1);
    auVar22._0_8_ = auVar97._0_8_ * auVar25._0_8_;
    auVar22._8_8_ = auVar97._8_8_ * auVar25._8_8_;
    auVar22._16_8_ = auVar24._0_8_ * auVar25._16_8_;
    auVar22._24_8_ = auVar24._8_8_ * auVar25._24_8_;
    auVar24._8_8_ = local_248._M_real;
    auVar24._0_8_ = local_248._M_real;
    auVar24._16_8_ = local_248._M_real;
    auVar24._24_8_ = local_248._M_real;
    auVar22 = vfmsub231pd_avx512vl(auVar22,auVar86,auVar24);
    auVar25._8_8_ = local_268._M_imag_i;
    auVar25._0_8_ = local_268._M_real;
    auVar25._16_8_ = local_268._M_imag_j;
    auVar25._24_8_ = local_268._M_imag_k;
    auVar24 = *(undefined1 (*) [32])
               ((long)&(local_228.
                        super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar21);
    auVar97 = *(undefined1 (*) [16])
               ((long)&(local_228.
                        super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_imag_j + lVar21);
    auVar23 = vpermpd_avx2(auVar25,0x9f);
    auVar2 = vunpckhpd_avx(auVar97,auVar24._0_16_);
    auVar1 = vshufpd_avx(auVar97,auVar97,1);
    auVar98._0_8_ = auVar1._0_8_ * auVar23._0_8_;
    auVar98._8_8_ = auVar1._8_8_ * auVar23._8_8_;
    auVar98._16_8_ = auVar2._0_8_ * auVar23._16_8_;
    auVar98._24_8_ = auVar2._8_8_ * auVar23._24_8_;
    auVar23._8_8_ = local_268._M_real;
    auVar23._0_8_ = local_268._M_real;
    auVar23._16_8_ = local_268._M_real;
    auVar23._24_8_ = local_268._M_real;
    auVar23 = vfmsub231pd_avx512vl(auVar98,auVar24,auVar23);
    dVar27 = *(double *)
              ((long)&(local_3a8.
                       super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar21);
    auVar42._8_8_ = 0;
    auVar42._0_8_ =
         *(ulong *)((long)&(local_3a8.
                            super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_imag_i + lVar21);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar27 * dVar27;
    auVar1 = vfmadd231sd_fma(auVar28,auVar42,auVar42);
    auVar43._8_8_ = 0;
    auVar43._0_8_ =
         *(ulong *)((long)&(local_3a8.
                            super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_imag_j + lVar21);
    auVar1 = vfmadd213sd_fma(auVar43,auVar43,auVar1);
    auVar29._8_8_ = 0;
    auVar29._0_8_ =
         *(ulong *)((long)&(local_3a8.
                            super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_imag_k + lVar21);
    auVar1 = vfmadd213sd_fma(auVar29,auVar29,auVar1);
    if (auVar1._0_8_ < 0.0) {
      local_288 = ZEXT1632(auVar37);
      local_2e8 = ZEXT1632(auVar97);
      local_348 = auVar23;
      local_328 = auVar25;
      local_308 = auVar15;
      local_2c8 = auVar24;
      local_2a8 = auVar22;
      dVar27 = sqrt(auVar1._0_8_);
      auVar86._8_8_ = uStack_360;
      auVar86._0_8_ = local_368;
      auVar86._16_8_ = puStack_358;
      auVar86._24_8_ = ppcStack_350;
      auVar15 = local_308;
      auVar22 = local_2a8;
      auVar24 = local_2c8;
      auVar25 = local_328;
      auVar23 = local_348;
      auVar37 = local_288._0_16_;
      auVar97 = local_2e8._0_16_;
    }
    else {
      auVar1 = vsqrtsd_avx(auVar1,auVar1);
      dVar27 = auVar1._0_8_;
    }
    auVar31 = vpermpd_avx2(auVar86,0xe9);
    auVar98 = vshufpd_avx(auVar15,auVar15,0xb);
    auVar15 = vpermpd_avx2(auVar15,0x7a);
    auVar86 = vpermpd_avx2(auVar86,1);
    auVar60._0_8_ = auVar98._0_8_ * auVar86._0_8_;
    auVar60._8_8_ = auVar98._8_8_ * auVar86._8_8_;
    auVar60._16_8_ = auVar98._16_8_ * auVar86._16_8_;
    auVar60._24_8_ = auVar98._24_8_ * auVar86._24_8_;
    auVar46._16_16_ = auVar31._0_16_;
    auVar46._0_16_ = auVar37;
    auVar2 = vfmadd213pd_fma(auVar46,auVar15,auVar60);
    auVar15 = vshufpd_avx(auVar25,auVar25,0xb);
    auVar25 = vpermpd_avx2(auVar25,0x7a);
    auVar86 = vpermpd_avx2(auVar24,1);
    auVar61._0_8_ = auVar15._0_8_ * auVar86._0_8_;
    auVar61._8_8_ = auVar15._8_8_ * auVar86._8_8_;
    auVar61._16_8_ = auVar15._16_8_ * auVar86._16_8_;
    auVar61._24_8_ = auVar15._24_8_ * auVar86._24_8_;
    auVar1 = vshufpd_avx(auVar24._0_16_,auVar97,1);
    auVar87._16_16_ = auVar1;
    auVar87._0_16_ = auVar97;
    auVar97 = vfmadd213pd_fma(auVar87,auVar25,auVar61);
    auVar44._0_8_ = auVar22._0_8_ + -auVar2._0_8_ + auVar23._0_8_ + -auVar97._0_8_;
    auVar44._8_8_ = auVar22._8_8_ + auVar2._8_8_ + auVar23._8_8_ + auVar97._8_8_;
    auVar47._16_8_ = auVar22._16_8_ + 0.0 + auVar23._16_8_ + 0.0;
    auVar47._0_16_ = auVar44;
    auVar47._24_8_ = auVar22._24_8_ + 0.0 + auVar23._24_8_ + 0.0;
    auVar59._0_8_ = (*(double *)((long)&pqVar16->_M_real + lVar21) / dVar27) / dVar27;
    auVar74._0_8_ = (-*(double *)((long)&pqVar16->_M_imag_i + lVar21) / dVar27) / dVar27;
    auVar74._8_8_ = 0x8000000000000000;
    auVar59._8_8_ = auVar59._0_8_;
    auVar62._16_8_ = auVar59._0_8_;
    auVar62._0_16_ = auVar59;
    auVar62._24_8_ = auVar59._0_8_;
    auVar97 = vunpcklpd_avx(auVar59,auVar74);
    auVar85._0_8_ = (-*(double *)((long)&pqVar16->_M_imag_j + lVar21) / dVar27) / dVar27;
    auVar85._8_8_ = auVar85._0_8_;
    auVar88._16_8_ = auVar85._0_8_;
    auVar88._0_16_ = auVar85;
    auVar88._24_8_ = auVar85._0_8_;
    auVar15 = vblendpd_avx(ZEXT1632(auVar97),auVar88,4);
    auVar31._0_8_ = (-*(double *)((long)&pqVar16->_M_imag_k + lVar21) / dVar27) / dVar27;
    auVar31._8_8_ = auVar31._0_8_;
    auVar31._16_8_ = auVar31._0_8_;
    auVar31._24_8_ = auVar31._0_8_;
    auVar15 = vblendpd_avx(auVar15,auVar31,8);
    auVar25 = vshufpd_avx(auVar47,auVar47,0xb);
    auVar97 = vunpckhpd_avx(auVar47._16_16_,auVar44);
    auVar96._8_8_ = auVar47._16_8_;
    auVar96._0_8_ = auVar47._16_8_;
    auVar96._16_16_ = auVar97;
    auVar97 = vunpcklpd_avx(auVar74,auVar59);
    auVar24 = vblendpd_avx(ZEXT1632(auVar97),auVar62,0xc);
    auVar97 = vunpcklpd_avx(auVar74,auVar85);
    auVar89._16_16_ = auVar97;
    auVar89._0_16_ = auVar15._16_16_;
    auVar63._0_8_ = auVar25._0_8_ * auVar24._0_8_;
    auVar63._8_8_ = auVar25._8_8_ * auVar24._8_8_;
    auVar63._16_8_ = auVar25._16_8_ * auVar24._16_8_;
    auVar63._24_8_ = auVar25._24_8_ * auVar24._24_8_;
    auVar97 = vfmadd231pd_fma(auVar63,auVar96,auVar89);
    auVar90._8_8_ = auVar44._0_8_;
    auVar90._0_8_ = auVar44._0_8_;
    auVar90._16_8_ = auVar44._0_8_;
    auVar90._24_8_ = auVar44._0_8_;
    auVar24 = vpermt2pd_avx512f(_DAT_002494e0,auVar47);
    auVar25 = vpermt2pd_avx512f(_DAT_00248800,ZEXT1632(auVar74));
    auVar48._0_8_ = auVar25._0_8_ * auVar24._0_8_;
    auVar48._8_8_ = auVar25._8_8_ * auVar24._8_8_;
    auVar48._16_8_ = auVar25._16_8_ * auVar24._16_8_;
    auVar48._24_8_ = auVar25._24_8_ * auVar24._24_8_;
    auVar1 = vfmsub231pd_fma(auVar48,auVar15,auVar90);
    auVar30._0_8_ = auVar1._0_8_ + -auVar97._0_8_;
    auVar30._8_8_ = auVar1._8_8_ + auVar97._8_8_;
    auVar97 = vshufpd_avx(auVar30,auVar30,1);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = (auVar30._0_8_ + -1.0) * (auVar30._0_8_ + -1.0);
    auVar97 = vfmadd213sd_fma(auVar97,auVar97,auVar45);
    auVar1 = vfmadd231sd_fma(auVar97,(undefined1  [16])0x0,(undefined1  [16])0x0);
    auVar97 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,1);
    auVar97 = vfmadd213sd_fma(auVar97,auVar97,auVar1);
    if (auVar97._0_8_ < 0.0) {
      dVar27 = sqrt(auVar97._0_8_);
    }
    else {
      auVar97 = vsqrtsd_avx(auVar97,auVar97);
      dVar27 = auVar97._0_8_;
    }
    local_210[0] = dVar27 < 1e-12;
    local_208 = 0;
    sStack_200.pi_ = (sp_counted_base *)0x0;
    local_1e8 = "( HAXX::norm(((ALPHA*tmp + BETA*YC[i]) * HAXX::inv(Y[i]))- 1.) < 1e-12 )";
    local_1e0 = "";
    local_388._M_imag_i._0_1_ = 0;
    local_388._M_real = (double)&PTR__lazy_ostream_002698f0;
    local_388._M_imag_j = (double)&boost::unit_test::lazy_ostream::inst;
    local_388._M_imag_k = (double)&local_1e8;
    local_1f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_1f0 = "";
    boost::test_tools::tt_detail::report_assertion(local_210,&local_388,&local_1f8,0x47,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_200);
    pqVar17 = pqVar17 + 100;
    lVar21 = lVar21 + 0x20;
  } while (lVar21 != 0xc80);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_228.
      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.
                    super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pqVar17 = local_390;
  if (local_3a8.
      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (quaternion<double> *)0x0) {
    operator_delete(local_3a8.
                    super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3a8.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3a8.
                          super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(X,0xc80);
  operator_delete(pqVar17,320000);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(hblas2_gemv_square_CQR_LDSame) {
  hblas2_gemv_square_LDSame<HAXX::quaternion<double>,double,'C'>(); 
}